

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

void dummy_ScrFunc_OP_NewScFunc(void)

{
  return;
}

Assistant:

ScriptFunction * ScriptFunction::OP_NewScFuncHomeObj(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, Var homeObj)
    {
        Assert(homeObj != nullptr);
        Assert((*infoRef)->GetFunctionProxy()->GetFunctionInfo()->HasHomeObj());
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScFuncHomeObj, reentrancylock, (*infoRef)->GetFunctionProxy()->GetScriptContext()->GetThreadContext());

        ScriptFunction* scriptFunc = ScriptFunction::OP_NewScFunc(environment, infoRef);
        scriptFunc->SetHomeObj(homeObj);

        // After setting homeobject we need to set the name if the object is ready.
        if ((*infoRef)->GetFunctionProxy()->GetUndeferredFunctionType())
        {
            if (!scriptFunc->IsAnonymousFunction() && 
                !scriptFunc->GetFunctionInfo()->IsClassConstructor() && 
                !scriptFunc->GetFunctionProxy()->EnsureDeserialized()->GetIsStaticNameFunction())
            {
                JavascriptString * functionName = scriptFunc->GetDisplayNameImpl();
                scriptFunc->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
        }

        return scriptFunc;
        JIT_HELPER_END(ScrFunc_OP_NewScFuncHomeObj);
    }